

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_getFormFields
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_httpreq_ext *pvVar3;
  char *pcVar4;
  vm_val_t *in_RDX;
  CVmObjHTTPRequest *in_RDI;
  CVmObjLookupTable *tab;
  int typ;
  char *ct;
  StringRef *body;
  TadsHttpRequestHeader *hdrs;
  TadsHttpRequest *req;
  char *in_stack_000000c0;
  StringRef *in_stack_000000c8;
  CVmObjLookupTable *in_stack_000000d0;
  CVmNativeCodeDesc *in_stack_ffffffffffffff78;
  uint init_capacity;
  uint *in_stack_ffffffffffffff80;
  vm_val_t *this_00;
  TadsHttpRequestHeader *in_stack_ffffffffffffff88;
  int local_5c;
  StringRef *this_01;
  TadsHttpRequestHeader *p;
  TadsHttpRequest *tab_00;
  void *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  
  if ((getp_getFormFields(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getFormFields(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getFormFields::desc,0);
    __cxa_guard_release(&getp_getFormFields(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78);
  init_capacity = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if (iVar1 == 0) {
    pvVar3 = get_ext(in_RDI);
    tab_00 = pvVar3->req;
    p = tab_00->hdr_list;
    this_01 = tab_00->body;
    if (tab_00->overflow == 0) {
      if (this_01 == (StringRef *)0x0) {
        vm_val_t::set_nil(in_RDX);
      }
      else {
        pcVar4 = TadsHttpRequestHeader::find
                           (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
        if (pcVar4 != (char *)0x0) {
          iVar1 = memicmp(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)tab_00);
          if (iVar1 == 0) {
            local_5c = 0;
          }
          else {
            iVar1 = memicmp(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)tab_00);
            if (iVar1 != 0) {
              vm_val_t::set_nil(in_RDX);
              return 1;
            }
            local_5c = 1;
          }
        }
        this_00 = in_RDX;
        vVar2 = CVmObjLookupTable::create((int)((ulong)in_RDX >> 0x20),(uint)in_RDX,init_capacity);
        vm_val_t::set_obj(this_00,vVar2);
        CVmStack::push(in_RDX);
        vm_objp(0);
        if (local_5c == 0) {
          StringRef::get(this_01);
          parse_query_params((CVmObjLookupTable *)tab_00,(char *)p,(int)((ulong)this_01 >> 0x20));
        }
        else if (local_5c == 1) {
          parse_multipart(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
        }
        CVmStack::discard();
      }
    }
    else {
      vVar2 = CVmObjString::create
                        ((int)((ulong)in_RDI >> 0x20),(char *)in_RDX,
                         (size_t)in_stack_ffffffffffffff80);
      vm_val_t::set_obj(in_RDX,vVar2);
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getFormFields(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;
    StringRef *body = req->body;

    /* if the body was too large, return 'overflow' */
    if (req->overflow)
    {
        retval->set_obj(CVmObjString::create(vmg_ FALSE, "overflow", 8));
        return TRUE;
    }

    /* if there's no message body, there are no form fields */
    if (body == 0)
    {
        retval->set_nil();
        return TRUE;
    }

    /* find the content type header */
    const char *ct = hdrs->find("content-type");
    int typ;
    if (ct != 0)
    {
        /* check what we have */
        if (memicmp(ct, "application/x-www-form-urlencoded", 33) == 0)
            typ = 0;
        else if (memicmp(ct, "multipart/form-data", 19) == 0)
            typ = 1;
        else
        {
            /* it's not a posted format we recognize - return nil */
            retval->set_nil();
            return TRUE;
        }
    }

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* parse the content type that we found */
    if (typ == 0)
    {
        /* 
         *   URL-encoded form data.  This is the same format as a URL query
         *   string, so we can just apply that parser to the message body. 
         */
        parse_query_params(vmg_ tab, body->get(), ENCMODE_FORM);
    }
    else if (typ == 1)
    {
        /* 
         *   Multipart form-data.  Invoke our generic multipart parser.  
         */
        parse_multipart(vmg_ tab, body, ct);
    }

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}